

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_object.hpp
# Opt level: O0

void __thiscall
jsoncons::
key_value<std::__cxx11::string,jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>
::key_value<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>const&>
          (key_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>
           *this,key_type *name,
          basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_> *args)

{
  string *in_RSI;
  string *in_RDI;
  basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_> *in_stack_ffffffffffffffc8;
  
  std::__cxx11::string::string(in_RDI,in_RSI);
  basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>::basic_json
            ((basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_> *)in_RDI,
             in_stack_ffffffffffffffc8);
  return;
}

Assistant:

key_value(key_type&& name,  Args&& ... args) 
            : key_(std::move(name)), value_(std::forward<Args>(args)...)
        {
        }